

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::fuse_convolutiondepthwise_add(NetOptimize *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_type pLVar4;
  value_type pLVar5;
  value_type pLVar6;
  int *piVar7;
  long lVar8;
  FILE *__stream;
  bool bVar9;
  size_type sVar10;
  reference ppLVar11;
  reference pvVar12;
  size_type sVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool *pbVar16;
  reference pvVar17;
  long in_RDI;
  int top_blob_index_final;
  int i_1;
  float *bias;
  Mat bias_data;
  bool broadcasting_type_ok;
  int channels;
  MemoryData *memorydata;
  size_t k;
  BinaryOp *binaryop;
  ConvolutionDepthWise *convolutiondepthwise;
  size_t j;
  int top_blob_index;
  size_t i;
  size_t layer_count;
  char *in_stack_fffffffffffffe48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe50;
  int local_144;
  void *local_128;
  int *local_120;
  undefined8 in_stack_fffffffffffffee8;
  undefined4 local_110;
  undefined4 in_stack_fffffffffffffef4;
  Mat *in_stack_fffffffffffffef8;
  undefined4 local_100;
  undefined4 local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  undefined4 local_f0;
  undefined8 local_e8;
  size_type local_d0;
  size_type local_b8;
  size_type local_a8;
  
  sVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                     (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58));
  local_a8 = 0;
  do {
    if (sVar10 <= local_a8) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),local_a8);
    bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    if (!bVar9) {
      ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_a8);
      pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->tops,0);
      iVar1 = *pvVar12;
      local_b8 = local_a8;
      do {
        do {
          do {
            local_b8 = local_b8 + 1;
            if (sVar10 <= local_b8) goto LAB_0013bd38;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_b8);
            bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
          } while (bVar9);
          ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                               (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                 (in_RDI + 0x58),local_b8);
          sVar13 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar11)->bottoms);
        } while (sVar13 != 2);
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_b8);
        pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->bottoms,0);
      } while (*pvVar12 != iVar1);
LAB_0013bd38:
      if (local_b8 != sVar10) {
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_a8);
        pLVar4 = *ppLVar11;
        ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                             (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                               (in_RDI + 0x58),local_b8);
        pLVar5 = *ppLVar11;
        if ((*(int *)&pLVar5[1]._vptr_Layer == 0) &&
           (*(int *)((long)&pLVar5[1]._vptr_Layer + 4) == 0)) {
          for (local_d0 = 0; local_d0 < local_b8; local_d0 = local_d0 + 1) {
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)(in_RDI + 0x58),
                       local_d0);
            bVar9 = std::operator!=(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
            if (!bVar9) {
              ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                   (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                     (in_RDI + 0x58),local_d0);
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar11)->tops,0);
              iVar1 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->bottoms,1);
              if (iVar1 == *pvVar12) break;
            }
          }
          if (local_d0 != local_b8) {
            ppLVar11 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                                 (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                                   (in_RDI + 0x58),local_d0);
            __stream = _stderr;
            pLVar6 = *ppLVar11;
            iVar1 = *(int *)&pLVar4[1]._vptr_Layer;
            bVar9 = false;
            if (((*(int *)&pLVar6[1]._vptr_Layer == iVar1) &&
                (*(int *)((long)&pLVar6[1]._vptr_Layer + 4) == 0)) &&
               (iVar2._0_1_ = pLVar6[1].support_bf16_storage,
               iVar2._1_1_ = pLVar6[1].support_fp16_storage,
               iVar2._2_1_ = pLVar6[1].support_int8_storage,
               iVar2._3_1_ = pLVar6[1].support_image_storage, iVar2 == 0)) {
              bVar9 = true;
            }
            if (((*(int *)&pLVar6[1]._vptr_Layer == 1) &&
                (*(int *)((long)&pLVar6[1]._vptr_Layer + 4) == 1)) &&
               (iVar3._0_1_ = pLVar6[1].support_bf16_storage,
               iVar3._1_1_ = pLVar6[1].support_fp16_storage,
               iVar3._2_1_ = pLVar6[1].support_int8_storage,
               iVar3._3_1_ = pLVar6[1].support_image_storage, iVar3 == iVar1)) {
              bVar9 = true;
            }
            if (bVar9) {
              uVar14 = std::__cxx11::string::c_str();
              uVar15 = std::__cxx11::string::c_str();
              fprintf(__stream,"fuse_convolutiondepthwise_add %s %s\n",uVar14,uVar15);
              ncnn::Mat::reshape(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4,
                                 (Allocator *)in_stack_fffffffffffffee8);
              if (*(int *)&pLVar4[1].type == 0) {
                *(undefined4 *)&pLVar4[1].type = 1;
                pbVar16 = &pLVar4[2].support_tensor_storage;
                if ((void **)pbVar16 != &local_128) {
                  if (local_120 != (int *)0x0) {
                    LOCK();
                    *local_120 = *local_120 + 1;
                    UNLOCK();
                  }
                  lVar8._0_1_ = pLVar4[2].support_reserved_6;
                  lVar8._1_1_ = pLVar4[2].support_reserved_7;
                  lVar8._2_1_ = pLVar4[2].support_reserved_8;
                  lVar8._3_1_ = pLVar4[2].support_reserved_9;
                  lVar8._4_4_ = pLVar4[2].featmask;
                  if (lVar8 != 0) {
                    piVar7 = *(int **)&pLVar4[2].support_reserved_6;
                    LOCK();
                    iVar1 = *piVar7;
                    *piVar7 = *piVar7 + -1;
                    UNLOCK();
                    if (iVar1 == 1) {
                      if (*(long *)&pLVar4[2].type == 0) {
                        if (*(void **)pbVar16 != (void *)0x0) {
                          free(*(void **)pbVar16);
                        }
                      }
                      else {
                        uVar14._0_1_ = pLVar4[2].support_tensor_storage;
                        uVar14._1_1_ = pLVar4[2].support_reserved_00;
                        uVar14._2_1_ = pLVar4[2].support_reserved_0;
                        uVar14._3_1_ = pLVar4[2].support_reserved_1;
                        uVar14._4_1_ = pLVar4[2].support_reserved_2;
                        uVar14._5_1_ = pLVar4[2].support_reserved_3;
                        uVar14._6_1_ = pLVar4[2].support_reserved_4;
                        uVar14._7_1_ = pLVar4[2].support_reserved_5;
                        (**(code **)(**(long **)&pLVar4[2].type + 0x18))
                                  (*(long **)&pLVar4[2].type,uVar14);
                      }
                    }
                  }
                  pLVar4[2].support_tensor_storage = false;
                  pLVar4[2].support_reserved_00 = false;
                  pLVar4[2].support_reserved_0 = false;
                  pLVar4[2].support_reserved_1 = false;
                  pLVar4[2].support_reserved_2 = false;
                  pLVar4[2].support_reserved_3 = false;
                  pLVar4[2].support_reserved_4 = false;
                  pLVar4[2].support_reserved_5 = false;
                  pLVar4[2].userdata = (void *)0x0;
                  pLVar4[2].typeindex = 0;
                  *(undefined4 *)&pLVar4[2].type._M_string_length = 0;
                  *(undefined4 *)((long)&pLVar4[2].type._M_string_length + 4) = 0;
                  *(undefined4 *)&pLVar4[2].type.field_2 = 0;
                  *(undefined4 *)((long)&pLVar4[2].type.field_2 + 4) = 0;
                  *(undefined4 *)((long)&pLVar4[2].type.field_2 + 8) = 0;
                  *(undefined8 *)&pLVar4[2].name = 0;
                  pLVar4[2].support_reserved_6 = false;
                  pLVar4[2].support_reserved_7 = false;
                  pLVar4[2].support_reserved_8 = false;
                  pLVar4[2].support_reserved_9 = false;
                  pLVar4[2].featmask = 0;
                  *(void **)pbVar16 = local_128;
                  *(int **)&pLVar4[2].support_reserved_6 = local_120;
                  pLVar4[2].userdata = (void *)in_stack_fffffffffffffee8;
                  pLVar4[2].typeindex = local_110;
                  *(Mat **)&pLVar4[2].type = in_stack_fffffffffffffef8;
                  *(undefined4 *)&pLVar4[2].type._M_string_length = local_100;
                  *(undefined4 *)((long)&pLVar4[2].type._M_string_length + 4) = local_fc;
                  *(undefined4 *)&pLVar4[2].type.field_2 = local_f8;
                  *(undefined4 *)((long)&pLVar4[2].type.field_2 + 4) = local_f4;
                  *(undefined4 *)((long)&pLVar4[2].type.field_2 + 8) = local_f0;
                  *(undefined8 *)&pLVar4[2].name = local_e8;
                }
              }
              else {
                lVar8 = *(long *)&pLVar4[2].support_tensor_storage;
                for (local_144 = 0; local_144 < iVar1; local_144 = local_144 + 1) {
                  *(float *)(lVar8 + (long)local_144 * 4) =
                       *(float *)(lVar8 + (long)local_144 * 4) +
                       *(float *)((long)local_128 + (long)local_144 * 4);
                }
              }
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar5->tops,0);
              iVar1 = *pvVar12;
              pvVar12 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
              *pvVar12 = iVar1;
              pvVar17 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                                  (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)
                                    (in_RDI + 0x50),(long)iVar1);
              pvVar17->producer = (int)local_a8;
              std::__cxx11::string::operator=((string *)&pLVar5->type,"ncnnfused");
              in_stack_fffffffffffffe50 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_128;
              if (local_120 != (int *)0x0) {
                LOCK();
                iVar1 = *local_120;
                *local_120 = *local_120 + -1;
                UNLOCK();
                if (iVar1 == 1) {
                  if (in_stack_fffffffffffffef8 == (Mat *)0x0) {
                    if (local_128 != (void *)0x0) {
                      free(local_128);
                    }
                  }
                  else {
                    (**(code **)((long)in_stack_fffffffffffffef8->data + 0x18))
                              (in_stack_fffffffffffffef8,local_128);
                  }
                }
              }
              *(void **)in_stack_fffffffffffffe50 = (void *)0x0;
              (in_stack_fffffffffffffe50->field_2)._M_allocated_capacity = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50->field_2 + 8) = 0;
              *(undefined4 *)&in_stack_fffffffffffffe50[1]._M_string_length = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1]._M_string_length + 4) = 0;
              *(undefined4 *)&in_stack_fffffffffffffe50[1].field_2 = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1].field_2 + 4) = 0;
              *(undefined4 *)((long)&in_stack_fffffffffffffe50[1].field_2 + 8) = 0;
              *(void **)(in_stack_fffffffffffffe50 + 2) = (void *)0x0;
              in_stack_fffffffffffffe50->_M_string_length = 0;
            }
          }
        }
      }
    }
    local_a8 = local_a8 + 1;
  } while( true );
}

Assistant:

int NetOptimize::fuse_convolutiondepthwise_add()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "ConvolutionDepthWise")
            continue;

        // ConvolutionDepthWise - BinaryOp
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "BinaryOp")
                continue;

            if (layers[j]->bottoms.size() != 2)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse ConvolutionDepthWise - BinaryOp to ConvolutionDepthWise
        ncnn::ConvolutionDepthWise* convolutiondepthwise = (ncnn::ConvolutionDepthWise*)layers[i];
        ncnn::BinaryOp* binaryop = (ncnn::BinaryOp*)layers[j];

        if (binaryop->op_type != 0 || binaryop->with_scalar)
            continue;

        // MemoryData - ..... - BinaryOp
        size_t k = 0;
        for (; k < j; k++)
        {
            if (layers[k]->type != "MemoryData")
                continue;

            if (layers[k]->tops[0] == binaryop->bottoms[1])
                break;
        }

        if (k == j)
            continue;

        ncnn::MemoryData* memorydata = (ncnn::MemoryData*)layers[k];

        int channels = convolutiondepthwise->num_output;

        bool broadcasting_type_ok = false;
        if (memorydata->w == channels && memorydata->h == 0 && memorydata->c == 0)
            broadcasting_type_ok = true;
        if (memorydata->w == 1 && memorydata->h == 1 && memorydata->c == channels)
            broadcasting_type_ok = true;

        if (!broadcasting_type_ok)
        {
            // not bias-like broadcasting type
            continue;
        }

        fprintf(stderr, "fuse_convolutiondepthwise_add %s %s\n", convolutiondepthwise->name.c_str(), binaryop->name.c_str());

        ncnn::Mat bias_data = memorydata->data.reshape(channels);
        {
            if (convolutiondepthwise->bias_term == 0)
            {
                // init bias
                convolutiondepthwise->bias_term = 1;
                convolutiondepthwise->bias_data = bias_data;
            }
            else
            {
                float* bias = convolutiondepthwise->bias_data;
                for (int i = 0; i < channels; i++)
                {
                    bias[i] = bias[i] + bias_data[i];
                }
            }
        }

        int top_blob_index_final = binaryop->tops[0];
        convolutiondepthwise->tops[0] = top_blob_index_final;
        blobs[top_blob_index_final].producer = i;
        binaryop->type = "ncnnfused";
    }

    return 0;
}